

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_swap.cpp
# Opt level: O1

void Omega_h::filter_swap(Read<signed_char> *keep_cands,LOs *cands2edges,Reals *cand_quals)

{
  int *piVar1;
  Alloc *pAVar2;
  LOs kept2old;
  Read<signed_char> local_a8;
  Alloc *local_98;
  void *local_90;
  LOs local_88;
  LOs local_78;
  Read<signed_char> local_68;
  Read<int> local_58;
  Read<signed_char> local_48;
  Write<double> local_38;
  Write<int> local_28;
  
  local_48.write_.shared_alloc_.alloc = (keep_cands->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = (keep_cands->write_).shared_alloc_.direct_ptr;
  collect_marked((Omega_h *)&local_98,&local_48);
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_78.write_.shared_alloc_.alloc = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.write_.shared_alloc_.alloc = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_78.write_.shared_alloc_.direct_ptr = local_90;
  local_58.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
  unmap<int>((Omega_h *)&local_28,&local_78,&local_58,1);
  Read<int>::Read(&local_a8,&local_28);
  pAVar2 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  (cands2edges->write_).shared_alloc_.alloc = local_a8.write_.shared_alloc_.alloc;
  (cands2edges->write_).shared_alloc_.direct_ptr = local_a8.write_.shared_alloc_.direct_ptr;
  if ((((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
       local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_a8.write_.shared_alloc_.alloc)->use_count =
         (local_a8.write_.shared_alloc_.alloc)->use_count + -1;
    (cands2edges->write_).shared_alloc_.alloc =
         (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_a8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_a8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if (((ulong)local_28.shared_alloc_.alloc & 7) == 0 && local_28.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_28.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28.shared_alloc_.alloc);
      operator_delete(local_28.shared_alloc_.alloc,0x48);
    }
  }
  pAVar2 = local_58.write_.shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_78.write_.shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (cand_quals != (Reals *)0x0) {
    local_88.write_.shared_alloc_.alloc = local_98;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.write_.shared_alloc_.alloc = (Alloc *)(local_98->size * 8 + 1);
      }
      else {
        local_98->use_count = local_98->use_count + 1;
      }
    }
    local_88.write_.shared_alloc_.direct_ptr = local_90;
    local_68.write_.shared_alloc_.alloc = (cand_quals->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (cand_quals->write_).shared_alloc_.direct_ptr;
    unmap<double>((Omega_h *)&local_38,&local_88,&local_68,1);
    Read<double>::Read(&local_a8,&local_38);
    pAVar2 = (cand_quals->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
      piVar1 = &pAVar2->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar2);
        operator_delete(pAVar2,0x48);
      }
    }
    (cand_quals->write_).shared_alloc_.alloc = local_a8.write_.shared_alloc_.alloc;
    (cand_quals->write_).shared_alloc_.direct_ptr = local_a8.write_.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
         local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.write_.shared_alloc_.alloc)->use_count =
           (local_a8.write_.shared_alloc_.alloc)->use_count + -1;
      (cand_quals->write_).shared_alloc_.alloc =
           (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_a8.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.write_.shared_alloc_.direct_ptr = (void *)0x0;
    if (((ulong)local_38.shared_alloc_.alloc & 7) == 0 &&
        local_38.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.shared_alloc_.alloc);
        operator_delete(local_38.shared_alloc_.alloc,0x48);
      }
    }
    pAVar2 = local_68.write_.shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_88.write_.shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
  }
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    piVar1 = &local_98->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98);
      operator_delete(local_98,0x48);
    }
  }
  return;
}

Assistant:

void filter_swap(Read<I8> keep_cands, LOs* cands2edges, Reals* cand_quals) {
  auto kept2old = collect_marked(keep_cands);
  *cands2edges = unmap(kept2old, *cands2edges, 1);
  if (cand_quals) *cand_quals = unmap(kept2old, *cand_quals, 1);
}